

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O3

void __thiscall
FIX::HttpConnection::processRoot
          (HttpConnection *this,HttpMessage *request,stringstream *h,stringstream *b)

{
  pointer pcVar1;
  int iVar2;
  undefined *puVar3;
  bool bVar4;
  TABLE *pTVar5;
  ostream *poVar6;
  size_t sVar7;
  TAG *pTVar8;
  Session *pSVar9;
  long *plVar10;
  A *pAVar11;
  _Rb_tree_node_base *p_Var12;
  long *plVar13;
  _func_int **pp_Var14;
  size_type *psVar15;
  ostream *stream;
  string href;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  HR hr;
  EM em;
  CAPTION caption;
  TABLE table;
  string local_7c8;
  long *local_7a8;
  long local_7a0;
  long local_798;
  long lStack_790;
  undefined1 local_788 [48];
  long *local_758;
  long local_750;
  long local_748;
  long lStack_740;
  undefined **local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  undefined1 local_710 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_6f8 [25];
  ostream *local_560;
  TAG local_558;
  TAG local_3a0;
  TAG local_1e8;
  
  stream = (ostream *)(b + 0x10);
  HTML::TABLE::TABLE((TABLE *)&local_1e8,stream);
  pTVar5 = HTML::TABLE::border((TABLE *)&local_1e8,1);
  pTVar5 = HTML::TABLE::cellspacing(pTVar5,2);
  pTVar5 = HTML::TABLE::width(pTVar5,100);
  std::__ostream_insert<char,std::char_traits<char>>((pTVar5->super_TAG).m_stream,">",1);
  HTML::CAPTION::CAPTION((CAPTION *)&local_3a0,stream);
  std::__ostream_insert<char,std::char_traits<char>>(local_3a0.m_stream,">",1);
  HTML::EM::EM((EM *)&local_558,stream);
  std::__ostream_insert<char,std::char_traits<char>>(local_558.m_stream,">",1);
  Session::numSessions();
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," Sessions managed by QuickFIX",0x1d);
  HTML::HR::HR((HR *)local_710,stream);
  std::__ostream_insert<char,std::char_traits<char>>(local_560,">",1);
  HTML::TAG::~TAG((TAG *)local_710);
  puVar3 = HTML::NBSP;
  iVar2 = (int)stream;
  if (HTML::NBSP == (undefined *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar7 = strlen(HTML::NBSP);
    std::__ostream_insert<char,std::char_traits<char>>(stream,puVar3,sVar7);
  }
  HTML::A::A((A *)local_710,stream);
  HttpMessage::getParameterString_abi_cxx11_(&local_7c8,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_788,
                 "/resetSessions",&local_7c8);
  pTVar8 = &HTML::A::href((A *)local_710,(string *)local_788)->super_TAG;
  HTML::TAG::text<char[6]>(pTVar8,(char (*) [6])"RESET");
  pcVar1 = local_788 + 0x10;
  if ((pointer)local_788._0_8_ != pcVar1) {
    operator_delete((void *)local_788._0_8_,local_788._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG((TAG *)local_710);
  puVar3 = HTML::NBSP;
  if (HTML::NBSP == (undefined *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar7 = strlen(HTML::NBSP);
    std::__ostream_insert<char,std::char_traits<char>>(stream,puVar3,sVar7);
  }
  HTML::A::A((A *)local_710,stream);
  HttpMessage::getParameterString_abi_cxx11_(&local_7c8,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_788,
                 "/refreshSessions",&local_7c8);
  pTVar8 = &HTML::A::href((A *)local_710,(string *)local_788)->super_TAG;
  HTML::TAG::text<char[8]>(pTVar8,(char (*) [8])"REFRESH");
  if ((pointer)local_788._0_8_ != pcVar1) {
    operator_delete((void *)local_788._0_8_,local_788._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG((TAG *)local_710);
  puVar3 = HTML::NBSP;
  if (HTML::NBSP == (undefined *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar7 = strlen(HTML::NBSP);
    std::__ostream_insert<char,std::char_traits<char>>(stream,puVar3,sVar7);
  }
  HTML::A::A((A *)local_710,stream);
  HttpMessage::getParameterString_abi_cxx11_(&local_7c8,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_788,
                 "/enableSessions",&local_7c8);
  pTVar8 = &HTML::A::href((A *)local_710,(string *)local_788)->super_TAG;
  HTML::TAG::text<char[7]>(pTVar8,(char (*) [7])"ENABLE");
  if ((pointer)local_788._0_8_ != pcVar1) {
    operator_delete((void *)local_788._0_8_,local_788._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG((TAG *)local_710);
  puVar3 = HTML::NBSP;
  if (HTML::NBSP == (undefined *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar7 = strlen(HTML::NBSP);
    std::__ostream_insert<char,std::char_traits<char>>(stream,puVar3,sVar7);
  }
  HTML::A::A((A *)local_710,stream);
  HttpMessage::getParameterString_abi_cxx11_(&local_7c8,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_788,
                 "/disableSessions",&local_7c8);
  pTVar8 = &HTML::A::href((A *)local_710,(string *)local_788)->super_TAG;
  HTML::TAG::text<char[8]>(pTVar8,(char (*) [8])"DISABLE");
  if ((pointer)local_788._0_8_ != pcVar1) {
    operator_delete((void *)local_788._0_8_,local_788._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG((TAG *)local_710);
  HTML::TAG::~TAG(&local_558);
  HTML::TAG::~TAG(&local_3a0);
  HTML::TR::TR((TR *)&local_3a0,stream);
  std::__ostream_insert<char,std::char_traits<char>>(local_3a0.m_stream,">",1);
  HTML::TD::TD((TD *)&local_558,stream);
  pp_Var14 = (_func_int **)(local_710 + 0x10);
  local_710._0_8_ = pp_Var14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"center","");
  pTVar8 = &HTML::TD::align((TD *)&local_558,(string *)local_710)->super_TAG;
  HTML::TAG::text<char[8]>(pTVar8,(char (*) [8])0x1c8409);
  if ((_func_int **)local_710._0_8_ != pp_Var14) {
    operator_delete((void *)local_710._0_8_,(ulong)(local_710._16_8_ + 1));
  }
  HTML::TAG::~TAG(&local_558);
  HTML::TD::TD((TD *)&local_558,stream);
  local_710._0_8_ = pp_Var14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"center","");
  pTVar8 = &HTML::TD::align((TD *)&local_558,(string *)local_710)->super_TAG;
  HTML::TAG::text<char[15]>(pTVar8,(char (*) [15])0x1ce64f);
  if ((_func_int **)local_710._0_8_ != pp_Var14) {
    operator_delete((void *)local_710._0_8_,(ulong)(local_710._16_8_ + 1));
  }
  HTML::TAG::~TAG(&local_558);
  HTML::TD::TD((TD *)&local_558,stream);
  local_710._0_8_ = pp_Var14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"center","");
  pTVar8 = &HTML::TD::align((TD *)&local_558,(string *)local_710)->super_TAG;
  HTML::TAG::text<char[8]>(pTVar8,(char (*) [8])"Enabled");
  if ((_func_int **)local_710._0_8_ != pp_Var14) {
    operator_delete((void *)local_710._0_8_,(ulong)(local_710._16_8_ + 1));
  }
  HTML::TAG::~TAG(&local_558);
  HTML::TD::TD((TD *)&local_558,stream);
  local_710._0_8_ = pp_Var14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"center","");
  pTVar8 = &HTML::TD::align((TD *)&local_558,(string *)local_710)->super_TAG;
  HTML::TAG::text<char[13]>(pTVar8,(char (*) [13])"Session Time");
  if ((_func_int **)local_710._0_8_ != pp_Var14) {
    operator_delete((void *)local_710._0_8_,(ulong)(local_710._16_8_ + 1));
  }
  HTML::TAG::~TAG(&local_558);
  HTML::TD::TD((TD *)&local_558,stream);
  local_710._0_8_ = pp_Var14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"center","");
  pTVar8 = &HTML::TD::align((TD *)&local_558,(string *)local_710)->super_TAG;
  HTML::TAG::text<char[10]>(pTVar8,(char (*) [10])"Logged On");
  if ((_func_int **)local_710._0_8_ != pp_Var14) {
    operator_delete((void *)local_710._0_8_,(ulong)(local_710._16_8_ + 1));
  }
  HTML::TAG::~TAG(&local_558);
  HTML::TD::TD((TD *)&local_558,stream);
  local_710._0_8_ = pp_Var14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"center","");
  pTVar8 = &HTML::TD::align((TD *)&local_558,(string *)local_710)->super_TAG;
  HTML::TAG::text<char[14]>(pTVar8,(char (*) [14])"Next Incoming");
  if ((_func_int **)local_710._0_8_ != pp_Var14) {
    operator_delete((void *)local_710._0_8_,(ulong)(local_710._16_8_ + 1));
  }
  HTML::TAG::~TAG(&local_558);
  HTML::TD::TD((TD *)&local_558,stream);
  local_710._0_8_ = pp_Var14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"center","");
  pTVar8 = &HTML::TD::align((TD *)&local_558,(string *)local_710)->super_TAG;
  HTML::TAG::text<char[14]>(pTVar8,(char (*) [14])"Next Outgoing");
  if ((_func_int **)local_710._0_8_ != pp_Var14) {
    operator_delete((void *)local_710._0_8_,(ulong)(local_710._16_8_ + 1));
  }
  HTML::TAG::~TAG(&local_558);
  HTML::TAG::~TAG(&local_3a0);
  Session::getSessions();
  if ((_Rb_tree_node_base *)local_788._24_8_ != (_Rb_tree_node_base *)(local_788 + 8)) {
    local_738 = &PTR__DateTime_001f59f0;
    p_Var12 = (_Rb_tree_node_base *)local_788._24_8_;
    do {
      pSVar9 = Session::lookupSession((SessionID *)(p_Var12 + 1));
      if (pSVar9 != (Session *)0x0) {
        HTML::TR::TR((TR *)&local_3a0,stream);
        std::__ostream_insert<char,std::char_traits<char>>(local_3a0.m_stream,">",1);
        HTML::TD::TD((TD *)&local_558,stream);
        std::__ostream_insert<char,std::char_traits<char>>(local_558.m_stream,">",1);
        std::operator+(&local_730,"/session?BeginString=",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &p_Var12[1]._M_left);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_730);
        local_758 = &local_748;
        plVar13 = plVar10 + 2;
        if ((long *)*plVar10 == plVar13) {
          local_748 = *plVar13;
          lStack_740 = plVar10[3];
        }
        else {
          local_748 = *plVar13;
          local_758 = (long *)*plVar10;
        }
        local_750 = plVar10[1];
        *plVar10 = (long)plVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_758,(ulong)p_Var12[4]._M_parent);
        local_7a8 = &local_798;
        plVar13 = plVar10 + 2;
        if ((long *)*plVar10 == plVar13) {
          local_798 = *plVar13;
          lStack_790 = plVar10[3];
        }
        else {
          local_798 = *plVar13;
          local_7a8 = (long *)*plVar10;
        }
        local_7a0 = plVar10[1];
        *plVar10 = (long)plVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_7a8);
        local_710._0_8_ = local_710 + 0x10;
        pp_Var14 = (_func_int **)(plVar10 + 2);
        if ((_func_int **)*plVar10 == pp_Var14) {
          local_710._16_8_ = *pp_Var14;
          aaStack_6f8[0]._0_8_ = plVar10[3];
        }
        else {
          local_710._16_8_ = *pp_Var14;
          local_710._0_8_ = (_func_int **)*plVar10;
        }
        local_710._8_8_ = plVar10[1];
        *plVar10 = (long)pp_Var14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append(local_710,*(ulong *)(p_Var12 + 7));
        local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
        psVar15 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_7c8.field_2._M_allocated_capacity = *psVar15;
          local_7c8.field_2._8_8_ = plVar10[3];
        }
        else {
          local_7c8.field_2._M_allocated_capacity = *psVar15;
          local_7c8._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_7c8._M_string_length = plVar10[1];
        *plVar10 = (long)psVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if ((undefined1 *)local_710._0_8_ != local_710 + 0x10) {
          operator_delete((void *)local_710._0_8_,(ulong)(local_710._16_8_ + 1));
        }
        if (local_7a8 != &local_798) {
          operator_delete(local_7a8,local_798 + 1);
        }
        if (local_758 != &local_748) {
          operator_delete(local_758,local_748 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_730._M_dataplus._M_p != &local_730.field_2) {
          operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
        }
        if (p_Var12[9]._M_left != (_Base_ptr)0x0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_710,"&SessionQualifier=",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &p_Var12[9]._M_parent);
          std::__cxx11::string::_M_append((char *)&local_7c8,local_710._0_8_);
          if ((undefined1 *)local_710._0_8_ != local_710 + 0x10) {
            operator_delete((void *)local_710._0_8_,(ulong)(local_710._16_8_ + 1));
          }
        }
        HTML::A::A((A *)local_710,stream);
        pAVar11 = HTML::A::href((A *)local_710,&local_7c8);
        local_7a8 = &local_798;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7a8,p_Var12[10]._M_left,
                   (long)&(p_Var12[10]._M_left)->_M_color + (long)&(p_Var12[10]._M_right)->_M_color)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(pAVar11->super_TAG).field_0x38,(char *)local_7a8,local_7a0);
        std::__ostream_insert<char,std::char_traits<char>>((pAVar11->super_TAG).m_stream,">",1);
        if (local_7a8 != &local_798) {
          operator_delete(local_7a8,local_798 + 1);
        }
        HTML::TAG::~TAG((TAG *)local_710);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
        }
        HTML::TAG::~TAG(&local_558);
        HTML::TD::TD((TD *)&local_558,stream);
        local_710._0_8_ = "No sessions defined for acceptor";
        if ((pSVar9->m_state).m_initiate != false) {
          local_710._0_8_ = "No sessions defined for initiator";
        }
        local_710._0_8_ = local_710._0_8_ + 0x18;
        HTML::TAG::text<char_const*>(&local_558,(char **)local_710);
        HTML::TAG::~TAG(&local_558);
        HTML::TD::TD((TD *)&local_558,stream);
        local_710._0_8_ = "no";
        if ((pSVar9->m_state).m_enabled != false) {
          local_710._0_8_ = "yes";
        }
        HTML::TAG::text<char_const*>(&local_558,(char **)local_710);
        HTML::TAG::~TAG(&local_558);
        HTML::TD::TD((TD *)&local_558,stream);
        DateTime::nowUtc();
        local_7c8._M_string_length = local_710._8_8_;
        local_7c8.field_2._M_allocated_capacity = local_710._16_8_;
        local_7c8._M_dataplus._M_p = (pointer)local_738;
        bVar4 = TimeRange::isInRange(&pSVar9->m_sessionTime,(UtcTimeStamp *)&local_7c8);
        local_7a8 = (long *)0x1c84e0;
        if (bVar4) {
          local_7a8 = (long *)0x1c84dc;
        }
        HTML::TAG::text<char_const*>(&local_558,(char **)&local_7a8);
        HTML::TAG::~TAG(&local_558);
        HTML::TD::TD((TD *)&local_558,stream);
        local_710._0_8_ = "no";
        if (((pSVar9->m_state).m_receivedLogon & (pSVar9->m_state).m_sentLogon) != 0) {
          local_710._0_8_ = "yes";
        }
        HTML::TAG::text<char_const*>(&local_558,(char **)local_710);
        HTML::TAG::~TAG(&local_558);
        HTML::TD::TD((TD *)&local_558,stream);
        SessionState::getNextTargetMsgSeqNum(&pSVar9->m_state);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_558.field_0x38);
        std::__ostream_insert<char,std::char_traits<char>>(local_558.m_stream,">",1);
        HTML::TAG::~TAG(&local_558);
        HTML::TD::TD((TD *)&local_558,stream);
        SessionState::getNextSenderMsgSeqNum(&pSVar9->m_state);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_558.field_0x38);
        std::__ostream_insert<char,std::char_traits<char>>(local_558.m_stream,">",1);
        HTML::TAG::~TAG(&local_558);
        HTML::TAG::~TAG(&local_3a0);
      }
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    } while (p_Var12 != (_Rb_tree_node_base *)(local_788 + 8));
  }
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree((_Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
               *)local_788);
  HTML::TAG::~TAG(&local_1e8);
  return;
}

Assistant:

void HttpConnection::processRoot(const HttpMessage &request, std::stringstream &h, std::stringstream &b) {
  TABLE table(b);
  table.border(1).cellspacing(2).width(100).text();

  {
    CAPTION caption(b);
    caption.text();
    EM em(b);
    em.text();
    b << Session::numSessions() << " Sessions managed by QuickFIX";
    {
      HR hr(b);
      hr.text();
    }
    {
      b << NBSP;
      A a(b);
      a.href("/resetSessions" + request.getParameterString()).text("RESET");
    }
    {
      b << NBSP;
      A a(b);
      a.href("/refreshSessions" + request.getParameterString()).text("REFRESH");
    }
    {
      b << NBSP;
      A a(b);
      a.href("/enableSessions" + request.getParameterString()).text("ENABLE");
    }
    {
      b << NBSP;
      A a(b);
      a.href("/disableSessions" + request.getParameterString()).text("DISABLE");
    }
  }

  {
    TR tr(b);
    tr.text();
    {
      TD td(b);
      td.align("center").text("Session");
    }
    {
      TD td(b);
      td.align("center").text("ConnectionType");
    }
    {
      TD td(b);
      td.align("center").text("Enabled");
    }
    {
      TD td(b);
      td.align("center").text("Session Time");
    }
    {
      TD td(b);
      td.align("center").text("Logged On");
    }
    {
      TD td(b);
      td.align("center").text("Next Incoming");
    }
    {
      TD td(b);
      td.align("center").text("Next Outgoing");
    }
  }

  std::set<SessionID> sessions = Session::getSessions();
  for (const SessionID &sessionID : sessions) {
    Session *pSession = Session::lookupSession(sessionID);
    if (!pSession) {
      continue;
    }

    {
      TR tr(b);
      tr.text();
      {
        TD td(b);
        td.text();
        std::string href = "/session?BeginString=" + sessionID.getBeginString().getValue()
                           + "&SenderCompID=" + sessionID.getSenderCompID().getValue()
                           + "&TargetCompID=" + sessionID.getTargetCompID().getValue();
        if (sessionID.getSessionQualifier().size()) {
          href += "&SessionQualifier=" + sessionID.getSessionQualifier();
        }

        A a(b);
        a.href(href).text(sessionID.toString());
      }
      {
        TD td(b);
        td.text(pSession->isInitiator() ? "initiator" : "acceptor");
      }
      {
        TD td(b);
        td.text(pSession->isEnabled() ? "yes" : "no");
      }
      {
        TD td(b);
        td.text(pSession->isSessionTime(UtcTimeStamp::now()) ? "yes" : "no");
      }
      {
        TD td(b);
        td.text(pSession->isLoggedOn() ? "yes" : "no");
      }
      {
        TD td(b);
        td.text(pSession->getExpectedTargetNum());
      }
      {
        TD td(b);
        td.text(pSession->getExpectedSenderNum());
      }
    }
  }
}